

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_led.c
# Opt level: O0

pal_result pal_led_set_color(pal_led_color color)

{
  pal_led_color color_local;
  
  printf("This is the real pal_led_set_color\r\n");
  if (color == PAL_LED_RED) {
    printf("LED: RED\r\n");
  }
  else if (color == PAL_LED_YELLOW) {
    printf("LED: YELLOW\r\n");
  }
  else {
    if (color != PAL_LED_GREEN) {
      return PAL_ERROR_ARG;
    }
    printf("LED: GREEN\r\n");
  }
  return PAL_OK;
}

Assistant:

pal_result pal_led_set_color(pal_led_color color) {
    printf("This is the real pal_led_set_color\r\n");
    switch (color) {
    case PAL_LED_RED:    printf("LED: RED\r\n"); break;
    case PAL_LED_YELLOW: printf("LED: YELLOW\r\n"); break;
    case PAL_LED_GREEN:  printf("LED: GREEN\r\n"); break;
    default:             return PAL_ERROR_ARG;
    }
    return PAL_OK;
}